

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

int Internal_FloatArrayCompare(size_t count,float *a,float *b)

{
  int local_2c;
  int rc;
  float *e;
  float *b_local;
  float *a_local;
  size_t count_local;
  
  local_2c = ON_CompareFloat(*a,*b);
  e = b + 1;
  b_local = a + 1;
  while (local_2c == 0 && b_local < a + count) {
    local_2c = ON_CompareFloat(*b_local,*e);
    e = e + 1;
    b_local = b_local + 1;
  }
  return local_2c;
}

Assistant:

static int Internal_FloatArrayCompare(
  size_t count,
  const float* a,
  const float* b
  )
{
  const float* e = a + count;
  int rc = ON_CompareFloat(*a++, *b++);
  while( 0 == rc && a < e)
    rc = ON_CompareFloat(*a++, *b++);
  return rc;
}